

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

void dumpInfo(DataFieldInfo *info,Bounds iBounds,Bounds jBounds,Bounds kBounds,Bounds lBounds)

{
  ostream *poVar1;
  Bounds local_50;
  Bounds local_48;
  Bounds local_40;
  Bounds local_38;
  
  local_38.upper = info->iSize_ + -1;
  if (iBounds.upper <= local_38.upper) {
    local_38.upper = iBounds.upper;
  }
  local_38.lower = iBounds.lower;
  local_40.upper = info->jSize_ + -1;
  if (jBounds.upper <= local_40.upper) {
    local_40.upper = jBounds.upper;
  }
  local_40.lower = jBounds.lower;
  local_48.upper = info->kSize_ + -1;
  if (kBounds.upper <= local_48.upper) {
    local_48.upper = kBounds.upper;
  }
  local_48.lower = kBounds.lower;
  local_50.upper = info->lSize_ + -1;
  if (lBounds.upper <= local_50.upper) {
    local_50.upper = lBounds.upper;
  }
  local_50.lower = lBounds.lower;
  poVar1 = std::operator<<((ostream *)&std::cout,"Field: ");
  poVar1 = std::operator<<(poVar1,(string *)info);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  poVar1 = std::operator<<(poVar1,(string *)&info->type_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Rank: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->rank_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Bytes per Element: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->bytesPerElement_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"iSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->iSize_);
  poVar1 = std::operator<<(poVar1," ");
  operator<<(poVar1,&local_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"jSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->jSize_);
  poVar1 = std::operator<<(poVar1," ");
  operator<<(poVar1,&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"kSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->kSize_);
  poVar1 = std::operator<<(poVar1," ");
  operator<<(poVar1,&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"lSize: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info->lSize_);
  poVar1 = std::operator<<(poVar1," ");
  operator<<(poVar1,&local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void dumpInfo(const DataFieldInfo& info, Bounds iBounds, Bounds jBounds, Bounds kBounds, Bounds lBounds)
{
	iBounds.upper = std::min(iBounds.upper, info.iSize() - 1);
	jBounds.upper = std::min(jBounds.upper, info.jSize() - 1);
	kBounds.upper = std::min(kBounds.upper, info.kSize() - 1);
	lBounds.upper = std::min(lBounds.upper, info.lSize() - 1);

	std::cout << "Field: " << info.name() << std::endl;
	std::cout << "Type: " << info.type() << std::endl;
	std::cout << "Rank: " << info.rank() << std::endl;
	std::cout << "Bytes per Element: " << info.bytesPerElement() << std::endl;
	std::cout << "iSize: " << info.iSize() << " " << iBounds << std::endl;
	std::cout << "jSize: " << info.jSize() << " " << jBounds << std::endl;
	std::cout << "kSize: " << info.kSize() << " " << kBounds << std::endl;
	std::cout << "lSize: " << info.lSize() << " " << lBounds << std::endl;
}